

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O2

int __thiscall
String::clone(String *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _func_int **in_RAX;
  _Alloc_hider local_18;
  
  local_18._M_p = (pointer)in_RAX;
  std::make_unique<String,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffe8);
  (this->super_Value)._vptr_Value = (_func_int **)local_18._M_p;
  return (int)this;
}

Assistant:

std::unique_ptr<Value> String::clone() const
{
  return std::make_unique<String>(value_);
}